

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O0

int sexp_peek_char(sexp ctx,sexp in)

{
  long lVar1;
  long in_RSI;
  int c;
  sexp in_stack_00000030;
  sexp in_stack_00000038;
  uint local_1c;
  uint local_18;
  
  if (*(long *)(in_RSI + 0x28) == 0) {
    local_1c = getc(*(FILE **)(in_RSI + 0x20));
  }
  else {
    if (*(ulong *)(in_RSI + 0x38) < *(ulong *)(in_RSI + 0x50)) {
      lVar1 = *(long *)(in_RSI + 0x38);
      *(long *)(in_RSI + 0x38) = lVar1 + 1;
      local_18 = (uint)*(byte *)(*(long *)(in_RSI + 0x28) + lVar1);
    }
    else {
      local_18 = sexp_buffered_read_char(in_stack_00000038,in_stack_00000030);
    }
    local_1c = local_18;
  }
  if ((local_1c != 0xffffffff) && (local_1c != 0xffffffff)) {
    if (*(long *)(in_RSI + 0x28) == 0) {
      ungetc(local_1c,*(FILE **)(in_RSI + 0x20));
    }
    else {
      lVar1 = *(long *)(in_RSI + 0x38);
      *(long *)(in_RSI + 0x38) = lVar1 + -1;
      *(char *)(*(long *)(in_RSI + 0x28) + -1 + lVar1) = (char)local_1c;
    }
  }
  return local_1c;
}

Assistant:

static int sexp_peek_char(sexp ctx, sexp in) {
  int c = sexp_read_char(ctx, in);
  if (c != EOF) sexp_push_char(ctx, c, in);
  return c;
}